

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O3

void __thiscall
flatbuffers::rust::RustGenerator::ForAllEnumValues
          (RustGenerator *this,EnumDef *enum_def,function<void_()> *cb)

{
  _Any_data local_50;
  _Manager_type local_40;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:697:52)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_flatbuffers::EnumVal_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_rust.cpp:697:52)>
             ::_M_manager;
  local_30._M_unused._M_object = cb;
  std::function<void_(const_flatbuffers::EnumVal_&)>::function
            ((function<void_(const_flatbuffers::EnumVal_&)> *)&local_50,
             (function<void_(const_flatbuffers::EnumVal_&)> *)&local_30);
  ForAllEnumValues1(this,enum_def,(function<void_(const_flatbuffers::EnumVal_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void ForAllEnumValues(const EnumDef &enum_def, std::function<void()> cb) {
    std::function<void(const EnumVal &)> wrapped = [&](const EnumVal &unused) {
      (void)unused;
      cb();
    };
    ForAllEnumValues1(enum_def, wrapped);
  }